

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalCreateARTIndex::Finalize
          (PhysicalCreateARTIndex *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> *this_00;
  SchemaCatalogEntry *this_01;
  pointer puVar1;
  size_t __n;
  pointer pcVar2;
  CatalogTransaction transaction;
  int iVar3;
  pointer pBVar4;
  undefined4 extraout_var;
  pointer pCVar5;
  shared_ptr<duckdb::DataTableInfo,_true> *this_03;
  DataTableInfo *pDVar6;
  type pIVar7;
  undefined4 extraout_var_00;
  Catalog *this_04;
  AlterInfo *info;
  optional_ptr<duckdb::CatalogEntry,_true> oVar8;
  type pCVar9;
  undefined4 extraout_var_01;
  idx_t iVar10;
  CatalogException *pCVar11;
  TransactionException *this_05;
  GlobalSinkState *this_06;
  pointer this_07;
  string local_f8;
  pthread_mutex_t *local_d8;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> local_d0;
  DataTable *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  DataTable *this_02;
  
  this_06 = input->global_state + 1;
  pBVar4 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_06);
  BoundIndex::Vacuum(pBVar4);
  pBVar4 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_06);
  BoundIndex::VerifyAllocations(pBVar4);
  iVar3 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  this_02 = (DataTable *)CONCAT44(extraout_var,iVar3);
  if ((this_02->version)._M_i != MAIN_TABLE) {
    this_05 = (TransactionException *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "Transaction conflict: cannot add an index to a table that has been altered or dropped"
               ,"");
    TransactionException::TransactionException(this_05,&local_f8);
    __cxa_throw(this_05,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = (this->table->super_TableCatalogEntry).super_StandardEntry.schema;
  this_00 = &this->info;
  pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->(this_00);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pCVar5->column_ids,
             &(this->storage_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if ((this->alter_table_info).
      super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
      .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl == (AlterTableInfo *)0x0)
  {
    SchemaCatalogEntry::GetCatalogTransaction(&local_58,this_01,context);
    pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    transaction.context.ptr._0_4_ = (int)local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.context.ptr._4_4_ = (int)((ulong)local_58.context.ptr >> 0x20);
    transaction.transaction.ptr._0_4_ = (int)local_58.transaction.ptr;
    transaction.transaction.ptr._4_4_ = (int)((ulong)local_58.transaction.ptr >> 0x20);
    transaction.transaction_id._0_4_ = (int)local_58.transaction_id;
    transaction.transaction_id._4_4_ = (int)(local_58.transaction_id >> 0x20);
    transaction.start_time = local_58.start_time;
    oVar8 = SchemaCatalogEntry::GetEntry(this_01,transaction,INDEX_ENTRY,&pCVar5->index_name);
    if (oVar8.ptr != (CatalogEntry *)0x0) {
      pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      if ((pCVar5->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
        return READY;
      }
      pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"Index with name \"%s\" already exists!","");
      pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar2 = (pCVar5->index_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar2,pcVar2 + (pCVar5->index_name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>(pCVar11,&local_f8,&local_c0);
      __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    SchemaCatalogEntry::GetCatalogTransaction(&local_80,this_01,context);
    pCVar9 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator*(this_00);
    iVar3 = (*(this_01->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                      (this_01,pCVar9,this->table);
    pBVar4 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
             operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                         *)this_06);
    iVar10 = BoundIndex::GetInMemorySize(pBVar4);
    *(idx_t *)(CONCAT44(extraout_var_01,iVar3) + 0x1f8) = iVar10;
  }
  else {
    local_c8 = this_02;
    this_03 = DataTable::GetDataTableInfo(this_02);
    pDVar6 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_03);
    local_d8 = (pthread_mutex_t *)&pDVar6->indexes;
    iVar3 = pthread_mutex_lock(local_d8);
    if (iVar3 != 0) {
      ::std::__throw_system_error(iVar3);
    }
    puVar1 = (pDVar6->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_07 = (pDVar6->indexes).indexes.
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_07 != puVar1;
        this_07 = this_07 + 1) {
      pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (this_07);
      iVar3 = (*pIVar7->_vptr_Index[4])(pIVar7);
      pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      __n = ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1];
      if ((__n == (pCVar5->index_name)._M_string_length) &&
         ((__n == 0 ||
          (iVar3 = bcmp(*(void **)CONCAT44(extraout_var_00,iVar3),
                        (pCVar5->index_name)._M_dataplus._M_p,__n), iVar3 == 0)))) {
        pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"an index with that name already exists for this table: %s",
                   "");
        pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                 ::operator->(this_00);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar2 = (pCVar5->index_name)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar2,pcVar2 + (pCVar5->index_name)._M_string_length);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar11,&local_f8,&local_a0);
        __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pthread_mutex_unlock(local_d8);
    pCVar5 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    this_04 = Catalog::GetCatalog(context,&(pCVar5->super_CreateInfo).catalog);
    info = &unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>::
            operator*(&this->alter_table_info)->super_AlterInfo;
    Catalog::Alter(this_04,context,info);
    this_02 = local_c8;
  }
  local_d0._M_head_impl =
       (((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_> *)
        &this_06->_vptr_GlobalSinkState)->_M_t).
       super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
       super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl;
  (((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_> *)
   &this_06->_vptr_GlobalSinkState)->_M_t).
  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
  super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl = (BoundIndex *)0x0;
  DataTable::AddIndex(this_02,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *
                              )&local_d0);
  if (local_d0._M_head_impl != (BoundIndex *)0x0) {
    (*((local_d0._M_head_impl)->super_Index)._vptr_Index[1])();
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalCreateARTIndex::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &state = input.global_state.Cast<CreateARTIndexGlobalSinkState>();

	// Vacuum excess memory and verify.
	state.global_index->Vacuum();
	D_ASSERT(!state.global_index->VerifyAndToString(true).empty());
	state.global_index->VerifyAllocations();

	auto &storage = table.GetStorage();
	if (!storage.IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: cannot add an index to a table that has been altered or dropped");
	}

	auto &schema = table.schema;
	info->column_ids = storage_ids;

	if (!alter_table_info) {
		// Ensure that the index does not yet exist in the catalog.
		auto entry = schema.GetEntry(schema.GetCatalogTransaction(context), CatalogType::INDEX_ENTRY, info->index_name);
		if (entry) {
			if (info->on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT) {
				throw CatalogException("Index with name \"%s\" already exists!", info->index_name);
			}
			// IF NOT EXISTS on existing index. We are done.
			return SinkFinalizeType::READY;
		}

		auto index_entry = schema.CreateIndex(schema.GetCatalogTransaction(context), *info, table).get();
		D_ASSERT(index_entry);
		auto &index = index_entry->Cast<DuckIndexEntry>();
		index.initial_index_size = state.global_index->GetInMemorySize();

	} else {
		// Ensure that there are no other indexes with that name on this table.
		auto &indexes = storage.GetDataTableInfo()->GetIndexes();
		indexes.Scan([&](Index &index) {
			if (index.GetIndexName() == info->index_name) {
				throw CatalogException("an index with that name already exists for this table: %s", info->index_name);
			}
			return false;
		});

		auto &catalog = Catalog::GetCatalog(context, info->catalog);
		catalog.Alter(context, *alter_table_info);
	}

	// Add the index to the storage.
	storage.AddIndex(std::move(state.global_index));
	return SinkFinalizeType::READY;
}